

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O2

vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
* __thiscall
anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>::derivatives_at
          (vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           *__return_storage_ptr__,
          Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *this,double u,double v,
          Index order)

{
  Ref<anurbs::NurbsSurfaceGeometry<3L>_> local_28;
  
  Ref<anurbs::NurbsSurfaceGeometry<3L>_>::data(&local_28);
  (*((local_28.m_entry.
      super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_ptr)->super_EntryBase)._vptr_EntryBase[7])
            (u,v,__return_storage_ptr__,
             local_28.m_entry.
             super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,order);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vector> derivatives_at(const double u, const double v,
        const Index order) const override
    {
        return m_surface_geometry->derivatives_at(u, v, order);
    }